

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfect_hash_join_executor.cpp
# Opt level: O2

void __thiscall
duckdb::PerfectHashJoinExecutor::TemplatedFillSelectionVectorProbe<unsigned_short>
          (PerfectHashJoinExecutor *this,Vector *source,SelectionVector *build_sel_vec,
          SelectionVector *probe_sel_vec,idx_t count,idx_t *probe_sel_count)

{
  ushort uVar1;
  _Head_base<0UL,_bool_*,_false> _Var2;
  sel_t *psVar3;
  sel_t *psVar4;
  uint16_t uVar5;
  uint16_t uVar6;
  idx_t iVar7;
  long lVar8;
  ulong uVar9;
  idx_t i;
  idx_t iVar10;
  ulong uVar11;
  idx_t iVar12;
  long lVar13;
  UnifiedVectorFormat vector_data;
  UnifiedVectorFormat local_78;
  
  uVar5 = Value::GetValueUnsafe<unsigned_short>(&(this->perfect_join_statistics).build_min);
  uVar6 = Value::GetValueUnsafe<unsigned_short>(&(this->perfect_join_statistics).build_max);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(source,count,&local_78);
  iVar7 = *probe_sel_count;
  _Var2._M_head_impl =
       (this->bitmap_build_idx).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
       super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
       super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  psVar3 = build_sel_vec->sel_vector;
  psVar4 = probe_sel_vec->sel_vector;
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    lVar8 = 0;
    for (uVar11 = 0; count != uVar11; uVar11 = uVar11 + 1) {
      uVar9 = uVar11;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        uVar9 = (ulong)(local_78.sel)->sel_vector[uVar11];
      }
      uVar1 = *(ushort *)(local_78.data + uVar9 * 2);
      if ((uVar1 <= uVar6 && uVar5 <= uVar1) &&
         (lVar13 = (ulong)uVar1 - (ulong)uVar5, _Var2._M_head_impl[lVar13] == true)) {
        psVar3[lVar8] = (sel_t)lVar13;
        psVar4[lVar8] = (sel_t)uVar11;
        lVar8 = lVar8 + 1;
        iVar7 = iVar7 + 1;
        *probe_sel_count = iVar7;
      }
    }
  }
  else {
    lVar8 = 0;
    for (iVar10 = 0; count != iVar10; iVar10 = iVar10 + 1) {
      iVar12 = iVar10;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        iVar12 = (idx_t)(local_78.sel)->sel_vector[iVar10];
      }
      if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar12 >> 6]
           >> (iVar12 & 0x3f) & 1) != 0) {
        uVar1 = *(ushort *)(local_78.data + iVar12 * 2);
        if ((uVar1 <= uVar6 && uVar5 <= uVar1) &&
           (lVar13 = (ulong)uVar1 - (ulong)uVar5, _Var2._M_head_impl[lVar13] == true)) {
          psVar3[lVar8] = (sel_t)lVar13;
          psVar4[lVar8] = (sel_t)iVar10;
          lVar8 = lVar8 + 1;
          iVar7 = iVar7 + 1;
          *probe_sel_count = iVar7;
        }
      }
    }
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
  return;
}

Assistant:

void PerfectHashJoinExecutor::TemplatedFillSelectionVectorProbe(Vector &source, SelectionVector &build_sel_vec,
                                                                SelectionVector &probe_sel_vec, idx_t count,
                                                                idx_t &probe_sel_count) {
	auto min_value = perfect_join_statistics.build_min.GetValueUnsafe<T>();
	auto max_value = perfect_join_statistics.build_max.GetValueUnsafe<T>();

	UnifiedVectorFormat vector_data;
	source.ToUnifiedFormat(count, vector_data);
	auto data = reinterpret_cast<T *>(vector_data.data);
	auto validity_mask = &vector_data.validity;
	// build selection vector for non-dense build
	if (validity_mask->AllValid()) {
		for (idx_t i = 0, sel_idx = 0; i < count; ++i) {
			// retrieve value from vector
			auto data_idx = vector_data.sel->get_index(i);
			auto input_value = data[data_idx];
			// add index to selection vector if value in the range
			if (min_value <= input_value && input_value <= max_value) {
				auto idx = (idx_t)(input_value - min_value); // subtract min value to get the idx position
				                                             // check for matches in the build
				if (bitmap_build_idx[idx]) {
					build_sel_vec.set_index(sel_idx, idx);
					probe_sel_vec.set_index(sel_idx++, i);
					probe_sel_count++;
				}
			}
		}
	} else {
		for (idx_t i = 0, sel_idx = 0; i < count; ++i) {
			// retrieve value from vector
			auto data_idx = vector_data.sel->get_index(i);
			if (!validity_mask->RowIsValid(data_idx)) {
				continue;
			}
			auto input_value = data[data_idx];
			// add index to selection vector if value in the range
			if (min_value <= input_value && input_value <= max_value) {
				auto idx = (idx_t)(input_value - min_value); // subtract min value to get the idx position
				                                             // check for matches in the build
				if (bitmap_build_idx[idx]) {
					build_sel_vec.set_index(sel_idx, idx);
					probe_sel_vec.set_index(sel_idx++, i);
					probe_sel_count++;
				}
			}
		}
	}
}